

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFormatUtil.hpp
# Opt level: O1

ostream * tcu::Format::operator<<(ostream *str,Array<const_vk::VkMemoryHeap_*> *fmt)

{
  VkMemoryHeap *value;
  
  std::__ostream_insert<char,std::char_traits<char>>(str,"{ ",2);
  value = fmt->begin;
  if (value != fmt->end) {
    do {
      if (value != fmt->begin) {
        std::__ostream_insert<char,std::char_traits<char>>(str,", ",2);
      }
      ::vk::operator<<(str,value);
      value = value + 1;
    } while (value != fmt->end);
  }
  std::__ostream_insert<char,std::char_traits<char>>(str," }",2);
  return str;
}

Assistant:

std::ostream& operator<< (std::ostream& str, const Array<Iterator>& fmt)
{
	str << "{ ";
	for (Iterator cur = fmt.begin; cur != fmt.end; ++cur)
	{
		if (cur != fmt.begin)
			str << ", ";
		str << *cur;
	}
	str << " }";
	return str;
}